

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O2

void mqtt_codec_destroy(MQTTCODEC_HANDLE handle)

{
  if (handle != (MQTTCODEC_HANDLE)0x0) {
    BUFFER_delete(handle->headerData);
    free(handle);
    return;
  }
  return;
}

Assistant:

void mqtt_codec_destroy(MQTTCODEC_HANDLE handle)
{
    /* Codes_SRS_MQTT_CODEC_07_003: [If the handle parameter is NULL then mqtt_codec_destroy shall do nothing.] */
    if (handle != NULL)
    {
        MQTTCODEC_INSTANCE* codecData = (MQTTCODEC_INSTANCE*)handle;
        /* Codes_SRS_MQTT_CODEC_07_004: [mqtt_codec_destroy shall deallocate all memory that has been allocated by this object.] */
        BUFFER_delete(codecData->headerData);
        free(codecData);
    }
}